

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfm.cpp
# Opt level: O2

void embree::storePFM(Ref<embree::Image> *img,FileName *fileName)

{
  ostream *poVar1;
  ssize_t x;
  long lVar2;
  Image *pIVar3;
  size_t sVar4;
  Color4 c;
  fstream file;
  ostream local_230 [512];
  
  std::fstream::fstream(&file);
  std::ios::exceptions((int)&file + (int)*(undefined8 *)(_file + -0x18));
  std::fstream::open((char *)&file,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  poVar1 = std::operator<<(local_230,"PF");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>(-1.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  pIVar3 = img->ptr;
  sVar4 = pIVar3->height;
  while (sVar4 = sVar4 - 1, -1 < (long)sVar4) {
    for (lVar2 = 0; lVar2 < (long)pIVar3->width; lVar2 = lVar2 + 1) {
      (*(pIVar3->super_RefCount)._vptr_RefCount[4])(&c,pIVar3,lVar2,sVar4);
      std::ostream::write((char *)local_230,(long)&c);
      pIVar3 = img->ptr;
    }
  }
  std::fstream::~fstream(&file);
  return;
}

Assistant:

void storePFM(const Ref<Image>& img, const FileName& fileName)
  {
    /* open file for writing */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::out | std::fstream::binary);

    /* write file header */
    file << "PF" << std::endl;
    file << img->width << " " << img->height << std::endl;
    file << -1.0f << std::endl;

    /* write image */
    for (ssize_t y=img->height-1; y>=0; y--) {
      for (ssize_t x=0; x<(ssize_t)img->width; x++) {
        const Color4 c = img->get(x,y);
        file.write((char*)&c,3*sizeof(float));
      }
    }
  }